

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int init_mixw(float32 **mixw,vector_t **mean,uint32 n_density,uint32 *veclen,uint32 n_frame,
             uint32 n_stream,codew_t *label)

{
  void *pvVar1;
  uint local_44;
  uint32 i;
  uint32 *occ_cnt;
  uint32 s;
  uint32 n_stream_local;
  uint32 n_frame_local;
  uint32 *veclen_local;
  uint32 n_density_local;
  vector_t **mean_local;
  float32 **mixw_local;
  
  pvVar1 = __ckd_calloc__((ulong)n_density,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                          ,0x36b);
  for (occ_cnt._4_4_ = 0; occ_cnt._4_4_ < n_stream; occ_cnt._4_4_ = occ_cnt._4_4_ + 1) {
    for (local_44 = 0; local_44 < n_frame; local_44 = local_44 + 1) {
      *(int *)((long)pvVar1 + (ulong)label[local_44] * 4) =
           *(int *)((long)pvVar1 + (ulong)label[local_44] * 4) + 1;
    }
    for (local_44 = 0; local_44 < n_density; local_44 = local_44 + 1) {
      mixw[occ_cnt._4_4_][local_44] =
           (float32)((float)*(uint *)((long)pvVar1 + (ulong)local_44 * 4) / (float)n_frame);
    }
  }
  return 0;
}

Assistant:

int
init_mixw(float32 **mixw,
	  vector_t **mean,
	  uint32 n_density,
	  const uint32 *veclen,
	  uint32 n_frame,
	  uint32 n_stream,
	  codew_t *label)
{
    uint32 s;
    uint32 *occ_cnt;
    uint32 i;

    occ_cnt = ckd_calloc(n_density, sizeof(uint32));

    for (s = 0; s < n_stream; s++) {
	for (i = 0; i < n_frame; i++) {
	    occ_cnt[label[i]]++;
	}

	for (i = 0; i < n_density; i++) {
	    mixw[s][i] = (float32)occ_cnt[i] / (float32)n_frame;
	}
    }
    return 0;
}